

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_disableEnable_Test::testBody(TEST_MockCallTest_disableEnable_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString SStack_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x21])(pMVar3);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"function");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"differenFunction");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar3->_vptr_MockSupport[0x26])(pMVar3);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(byte)((byte)iVar1 ^ 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x167,pTVar5);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x22])(pMVar3);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"function");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])(pMVar3);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar2 & 0xff),"CHECK","mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x16a,pTVar5);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"function");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar3 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])(pMVar3);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockCallTest, disableEnable)
{
    mock().disable();
    mock().expectOneCall("function");
    mock().actualCall("differenFunction");
    CHECK(! mock().expectedCallsLeft());
    mock().enable();
    mock().expectOneCall("function");
    CHECK(mock().expectedCallsLeft());
    mock().actualCall("function");

    mock().checkExpectations();
}